

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graphcycles.cc
# Opt level: O0

void __thiscall
absl::synchronization_internal::anon_unknown_0::Vec<int>::Grow(Vec<int> *this,uint32_t n)

{
  int *__result;
  int *copy;
  size_t request;
  uint32_t n_local;
  Vec<int> *this_local;
  
  while (this->capacity_ < n) {
    this->capacity_ = this->capacity_ << 1;
  }
  __result = (int *)base_internal::LowLevelAlloc::AllocWithArena
                              ((ulong)this->capacity_ << 2,(anonymous_namespace)::arena);
  std::copy<int*,int*>(this->ptr_,this->ptr_ + this->size_,__result);
  Discard(this);
  this->ptr_ = __result;
  return;
}

Assistant:

void Grow(uint32_t n) {
    while (capacity_ < n) {
      capacity_ *= 2;
    }
    size_t request = static_cast<size_t>(capacity_) * sizeof(T);
    T* copy = static_cast<T*>(
        base_internal::LowLevelAlloc::AllocWithArena(request, arena));
    std::copy(ptr_, ptr_ + size_, copy);
    Discard();
    ptr_ = copy;
  }